

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

string * soul::TokenisedPathString::removeTopLevelNameIfPresent
                   (string *__return_storage_ptr__,string *path,string *nameToRemove)

{
  bool bVar1;
  string_view s;
  string_view t;
  
  std::__cxx11::string::append((char *)nameToRemove);
  s._M_str = (nameToRemove->_M_dataplus)._M_p;
  s._M_len = nameToRemove->_M_string_length;
  t._M_str = (path->_M_dataplus)._M_p;
  t._M_len = path->_M_string_length;
  bVar1 = choc::text::startsWith(t,s);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string removeTopLevelNameIfPresent (const std::string& path, std::string nameToRemove)
    {
        nameToRemove += "::";

        if (choc::text::startsWith (path, nameToRemove))
            return path.substr (nameToRemove.length());

        return path;
    }